

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PSymbol * __thiscall PSymbolTable::FindSymbol(PSymbolTable *this,FName *symname,bool searchparents)

{
  Node *pNVar1;
  PSymbol *pPVar2;
  Node *pNVar3;
  FName local_4;
  
  pNVar1 = (this->Symbols).Nodes + ((this->Symbols).Size - 1 & symname->Index);
  while ((pNVar3 = pNVar1, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar1 = pNVar3->Next;
    if ((pNVar3->Pair).Key.Index == symname->Index) {
LAB_00379fe8:
      if ((searchparents && pNVar3 == (Node *)0x0) &&
         (this->ParentSymbolTable != (PSymbolTable *)0x0)) {
        pPVar2 = FindSymbol(this->ParentSymbolTable,&local_4,true);
      }
      else if (pNVar3 == (Node *)0x0) {
        pPVar2 = (PSymbol *)0x0;
      }
      else {
        pPVar2 = (pNVar3->Pair).Value;
      }
      return pPVar2;
    }
  }
  pNVar3 = (Node *)0x0;
  goto LAB_00379fe8;
}

Assistant:

PSymbol *PSymbolTable::FindSymbol (FName symname, bool searchparents) const
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL && searchparents && ParentSymbolTable != NULL)
	{
		return ParentSymbolTable->FindSymbol(symname, searchparents);
	}
	return value != NULL ? *value : NULL;
}